

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float128 int64_to_float128_ppc64(int64_t a,float_status *status)

{
  long lVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  float128 fVar7;
  
  if (a == 0) {
    return (float128)ZEXT816(0);
  }
  uVar2 = -a;
  if (0 < a) {
    uVar2 = a;
  }
  lVar1 = 0x3f;
  if (uVar2 != 0) {
    for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  bVar3 = (byte)lVar1 ^ 0x3f;
  bVar5 = bVar3 + 0x31;
  uVar6 = uVar2 >> 0x31;
  uVar4 = 0;
  if (uVar6 == 0) {
    uVar4 = uVar2;
  }
  bVar3 = bVar3 - 0xf;
  if (uVar6 != 0) {
    bVar3 = bVar5;
    uVar6 = uVar2;
  }
  fVar7.low = uVar6 << (bVar3 & 0x3f);
  if (bVar3 != 0) {
    uVar4 = uVar4 << (bVar3 & 0x3f) | uVar6 >> (-bVar3 & 0x3f);
  }
  fVar7.high = ((a & 0x8000000000000000U | 0x406e000000000000) - ((ulong)bVar5 << 0x30)) + uVar4;
  return fVar7;
}

Assistant:

float128 int64_to_float128(int64_t a, float_status *status)
{
    flag zSign;
    uint64_t absA;
    int8_t shiftCount;
    int32_t zExp;
    uint64_t zSig0, zSig1;

    if ( a == 0 ) return packFloat128( 0, 0, 0, 0 );
    zSign = ( a < 0 );
    absA = zSign ? - a : a;
    shiftCount = clz64(absA) + 49;
    zExp = 0x406E - shiftCount;
    if ( 64 <= shiftCount ) {
        zSig1 = 0;
        zSig0 = absA;
        shiftCount -= 64;
    }
    else {
        zSig1 = absA;
        zSig0 = 0;
    }
    shortShift128Left( zSig0, zSig1, shiftCount, &zSig0, &zSig1 );
    return packFloat128( zSign, zExp, zSig0, zSig1 );

}